

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_debug_line_section.cpp
# Opt level: O1

void __thiscall DebugLineSection_RoundTrip_Test::TestBody(DebugLineSection_RoundTrip_Test *this)

{
  undefined1 auVar1 [16];
  database *db;
  char *pcVar2;
  AssertionResult gtest_ar;
  uint8_t alignment;
  shared_ptr<const_pstore::repo::fragment> fragment;
  type *dls;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  dispatchers;
  transaction_type transaction;
  extent<unsigned_char> header_extent;
  digest header_digest;
  section_content content;
  undefined1 local_1b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  AssertHelper local_1a0;
  uchar local_191;
  container<unsigned_char> local_190;
  undefined1 local_180 [8];
  bool local_178;
  undefined7 uStack_177;
  debug_line_section *local_170;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  local_168;
  transaction<std::unique_lock<mock_mutex>_> local_150;
  extent<unsigned_char> local_118;
  _func_int **local_108;
  undefined8 uStack_100;
  undefined2 local_f0 [4];
  undefined8 local_e8;
  undefined2 local_e0 [64];
  void *local_60;
  long local_50;
  undefined2 *local_48;
  void *local_40;
  undefined8 uStack_38;
  long local_30;
  void *pvStack_28;
  undefined8 local_20;
  long lStack_18;
  
  local_190.end_ = local_190.begin_;
  local_191 = '\x04';
  local_108 = (_func_int **)0x89abcdef;
  uStack_100 = 0x1234567;
  local_118.addr.a_.a_ = (address)5;
  local_118.size = 7;
  local_f0[0] = 0x40e;
  memset(&local_e8,0,0xa0);
  local_40 = (void *)0x0;
  uStack_38 = 0;
  local_30 = 0;
  pvStack_28 = (void *)0x0;
  local_20 = 0;
  lStack_18 = 0;
  local_e0[0] = 0xd0b;
  local_e8 = 2;
  local_168.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
        *)0x0;
  local_168.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
        *)0x0;
  local_168.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
        *)0x0;
  local_48 = local_e0;
  local_150.super_transaction_base._vptr_transaction_base = (_func_int **)operator_new(0x40);
  ((section_creation_dispatcher *)local_150.super_transaction_base._vptr_transaction_base)->kind_ =
       debug_line;
  ((section_creation_dispatcher *)local_150.super_transaction_base._vptr_transaction_base)->
  _vptr_section_creation_dispatcher = (_func_int **)&PTR__section_creation_dispatcher_0019dd88;
  ((section_creation_dispatcher *)
  ((long)local_150.super_transaction_base._vptr_transaction_base + 0x10))->
  _vptr_section_creation_dispatcher = local_108;
  *(undefined8 *)
   &((section_creation_dispatcher *)
    ((long)local_150.super_transaction_base._vptr_transaction_base + 0x10))->kind_ = uStack_100;
  ((section_creation_dispatcher *)
  ((long)local_150.super_transaction_base._vptr_transaction_base + 0x20))->
  _vptr_section_creation_dispatcher = (_func_int **)local_118.addr.a_.a_;
  *(uint64_t *)
   &((section_creation_dispatcher *)
    ((long)local_150.super_transaction_base._vptr_transaction_base + 0x20))->kind_ = local_118.size;
  ((section_creation_dispatcher *)
  ((long)local_150.super_transaction_base._vptr_transaction_base + 0x30))->
  _vptr_section_creation_dispatcher = (_func_int **)local_f0;
  if (local_168.
      super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_168.
      super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
    ::_M_realloc_insert<pstore::repo::debug_line_section_creation_dispatcher*>
              ((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
                *)&local_168,
               (iterator)
               local_168.
               super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (debug_line_section_creation_dispatcher **)&local_150);
  }
  else {
    ((local_168.
      super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
    super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
    .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl =
         (section_creation_dispatcher *)local_150.super_transaction_base._vptr_transaction_base;
    local_168.
    super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_168.
         super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_180 = (undefined1  [8])&(this->super_DebugLineSection).field_0x10;
  local_178 = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_180);
  db = &(this->super_DebugLineSection).db_;
  local_178 = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_150,db,(lock_type *)local_180);
  if ((local_178 == true) && ((_Type)local_180 != (_Type)0x0)) {
    local_178 = false;
  }
  _local_1b0 = pstore::repo::fragment::
               alloc<pstore::transaction<std::unique_lock<mock_mutex>>,pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>
                         (&local_150,
                          (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                           )local_168.
                            super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                          (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                           )local_168.
                            super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
  pstore::repo::fragment::load((fragment *)local_180,db,(extent<pstore::repo::fragment> *)local_1b0)
  ;
  pstore::transaction_base::commit(&local_150.super_transaction_base);
  if ((*(byte *)((long)local_180 + 0x11) & 0x40) == 0) {
    local_170 = (debug_line_section *)0x0;
  }
  else {
    local_170 = pstore::repo::fragment::
                at_impl<(pstore::repo::section_kind)14,pstore::repo::fragment_const&,pstore::repo::debug_line_section_const>
                          ((fragment *)local_180);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_190.end_;
  local_190 = (container<unsigned_char>)(auVar1 << 0x40);
  testing::internal::CmpHelperNE<pstore::repo::debug_line_section_const*,decltype(nullptr)>
            ((internal *)local_1b0,"dls","nullptr",&local_170,&local_190.begin_);
  if (local_1b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_1a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_1a8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_debug_line_section.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_190);
  }
  else {
    if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1b0 + 8),local_1a8);
    }
    local_190.begin_._0_4_ = 1 << (*(byte *)&(local_170->g_).field_0 & 0x1f);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_char>
              ((internal *)local_1b0,"dls->align ()","alignment",(uint *)&local_190,&local_191);
    if (local_1b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_190);
      if (local_1a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_1a8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_debug_line_section.cpp"
                 ,0x54,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      if ((long *)local_190.begin_ != (long *)0x0) {
        (**(code **)(*(long *)local_190.begin_ + 8))();
      }
    }
    if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1b0 + 8),local_1a8);
    }
    testing::internal::CmpHelperEQ<pstore::uint128,pstore::uint128>
              ((internal *)local_1b0,"dls->header_digest ()","header_digest",
               &local_170->header_digest_,(uint128 *)&local_108);
    if (local_1b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_190);
      if (local_1a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_1a8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_debug_line_section.cpp"
                 ,0x55,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      if ((long *)local_190.begin_ != (long *)0x0) {
        (**(code **)(*(long *)local_190.begin_ + 8))();
      }
    }
    if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1b0 + 8),local_1a8);
    }
    testing::internal::CmpHelperEQ<pstore::extent<unsigned_char>,pstore::extent<unsigned_char>>
              ((internal *)local_1b0,"dls->header_extent ()","header_extent",&local_170->header_,
               &local_118);
    if (local_1b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_190);
      if (local_1a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_1a8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_debug_line_section.cpp"
                 ,0x56,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      if ((long *)local_190.begin_ != (long *)0x0) {
        (**(code **)(*(long *)local_190.begin_ + 8))();
      }
    }
    if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1b0 + 8),local_1a8);
    }
    local_1a0.data_._0_2_ = 0xb0d;
    local_190 = pstore::repo::generic_section::payload(&local_170->g_);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<unsigned_char,unsigned_char>>>
    ::operator()(local_1b0,(char *)&local_1a0,(container<unsigned_char> *)"dls->payload ()");
    if (local_1b0[0] != (internal)0x0) goto LAB_00114ffb;
    testing::Message::Message((Message *)&local_190);
    if (local_1a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_1a8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_debug_line_section.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_190);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_1a0);
  if ((long *)local_190.begin_ != (long *)0x0) {
    (**(code **)(*(long *)local_190.begin_ + 8))();
  }
LAB_00114ffb:
  if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1b0 + 8),local_1a8);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_177,local_178) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_177,local_178));
  }
  local_150.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0019b7e8
  ;
  pstore::transaction_base::rollback(&local_150.super_transaction_base);
  if ((local_150.lock_._M_owns == true) && (local_150.lock_._M_device != (mutex_type *)0x0)) {
    local_150.lock_._M_owns = false;
  }
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector(&local_168);
  if (pvStack_28 != (void *)0x0) {
    operator_delete(pvStack_28,lStack_18 - (long)pvStack_28);
  }
  if (local_40 != (void *)0x0) {
    operator_delete(local_40,local_30 - (long)local_40);
  }
  if (local_60 != (void *)0x0) {
    operator_delete(local_60,local_50 - (long)local_60);
  }
  return;
}

Assistant:

TEST_F (DebugLineSection, RoundTrip) {
    using pstore::repo::debug_line_section_creation_dispatcher;

    constexpr auto section_type = pstore::repo::section_kind::debug_line;
    constexpr auto alignment = std::uint8_t{4};
    constexpr auto header_digest = pstore::index::digest{0x01234567U, 0x89ABCDEF};
    constexpr auto header_extent =
        pstore::make_extent (pstore::typed_address<std::uint8_t>::make (5), 7);

    pstore::repo::section_content content{section_type, alignment};
    content.data.emplace_back (std::uint8_t{11});
    content.data.emplace_back (std::uint8_t{13});

    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    dispatchers.emplace_back (
        new debug_line_section_creation_dispatcher (header_digest, header_extent, &content));

    transaction_type transaction = begin (db_, lock_guard{mutex_});
    auto fragment = pstore::repo::fragment::load (
        db_, pstore::repo::fragment::alloc (transaction,
                                            pstore::make_pointee_adaptor (dispatchers.begin ()),
                                            pstore::make_pointee_adaptor (dispatchers.end ())));
    transaction.commit ();

    auto const * const dls = fragment->atp<section_type> ();
    ASSERT_NE (dls, nullptr);
    EXPECT_EQ (dls->align (), alignment);
    EXPECT_EQ (dls->header_digest (), header_digest);
    EXPECT_EQ (dls->header_extent (), header_extent);
    EXPECT_THAT (dls->payload (), testing::ElementsAre (std::uint8_t{11}, std::uint8_t{13}));
}